

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O1

void google::protobuf::TestUtil::
     ExpectLastRepeatedExtensionsRemovedPacked<proto2_unittest::TestPackedExtensions>
               (TestPackedExtensions *message)

{
  internal iVar1;
  bool bVar2;
  int iVar3;
  anon_union_32_1_493b367e_for_TestPackedExtensions_3 *this;
  char *pcVar4;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_70;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  AssertHelper local_38;
  
  local_68._M_head_impl._0_4_ = 1;
  this = &message->field_0;
  local_70.data_._0_4_ =
       (float)protobuf::internal::ExtensionSet::ExtensionSize
                        (&(this->_impl_)._extensions_,proto2_unittest::packed_int32_extension);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_58,"1","message.ExtensionSize(Traits::packed_int32_extension)",
             (int *)&local_68,(int *)&local_70);
  iVar1 = local_58[0];
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0xeea,pcVar4);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  if (iVar1 != (internal)0x0) {
    local_68._M_head_impl._0_4_ = 1;
    local_70.data_._0_4_ =
         (float)protobuf::internal::ExtensionSet::ExtensionSize
                          (&(this->_impl_)._extensions_,proto2_unittest::packed_int64_extension);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_58,"1","message.ExtensionSize(Traits::packed_int64_extension)",
               (int *)&local_68,(int *)&local_70);
    iVar1 = local_58[0];
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar4 = (local_50->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0xeeb,pcVar4);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
    if (iVar1 != (internal)0x0) {
      local_68._M_head_impl._0_4_ = 1;
      local_70.data_._0_4_ =
           (float)protobuf::internal::ExtensionSet::ExtensionSize
                            (&(this->_impl_)._extensions_,proto2_unittest::packed_uint32_extension);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_58,"1","message.ExtensionSize(Traits::packed_uint32_extension)",
                 (int *)&local_68,(int *)&local_70);
      iVar1 = local_58[0];
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_68);
        if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar4 = (local_50->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                   ,0xeec,pcVar4);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        if (local_68._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_68._M_head_impl + 8))();
        }
      }
      if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_50,local_50);
      }
      if (iVar1 != (internal)0x0) {
        local_68._M_head_impl._0_4_ = 1;
        local_70.data_._0_4_ =
             (float)protobuf::internal::ExtensionSet::ExtensionSize
                              (&(this->_impl_)._extensions_,proto2_unittest::packed_uint64_extension
                              );
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_58,"1","message.ExtensionSize(Traits::packed_uint64_extension)"
                   ,(int *)&local_68,(int *)&local_70);
        iVar1 = local_58[0];
        if (local_58[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_68);
          if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = anon_var_dwarf_a12c75 + 5;
          }
          else {
            pcVar4 = (local_50->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_70,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                     ,0xeed,pcVar4);
          testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
          testing::internal::AssertHelper::~AssertHelper(&local_70);
          if (local_68._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_68._M_head_impl + 8))();
          }
        }
        if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_50,local_50);
        }
        if (iVar1 != (internal)0x0) {
          local_68._M_head_impl._0_4_ = 1;
          local_70.data_._0_4_ =
               (float)protobuf::internal::ExtensionSet::ExtensionSize
                                (&(this->_impl_)._extensions_,
                                 proto2_unittest::packed_sint32_extension);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_58,"1",
                     "message.ExtensionSize(Traits::packed_sint32_extension)",(int *)&local_68,
                     (int *)&local_70);
          iVar1 = local_58[0];
          if (local_58[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_68);
            if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar4 = anon_var_dwarf_a12c75 + 5;
            }
            else {
              pcVar4 = (local_50->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_70,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                       ,0xeee,pcVar4);
            testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
            testing::internal::AssertHelper::~AssertHelper(&local_70);
            if (local_68._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_68._M_head_impl + 8))();
            }
          }
          if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_50,local_50);
          }
          if (iVar1 != (internal)0x0) {
            local_68._M_head_impl._0_4_ = 1;
            local_70.data_._0_4_ =
                 (float)protobuf::internal::ExtensionSet::ExtensionSize
                                  (&(this->_impl_)._extensions_,
                                   proto2_unittest::packed_sint64_extension);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_58,"1",
                       "message.ExtensionSize(Traits::packed_sint64_extension)",(int *)&local_68,
                       (int *)&local_70);
            iVar1 = local_58[0];
            if (local_58[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_68);
              if (local_50 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = anon_var_dwarf_a12c75 + 5;
              }
              else {
                pcVar4 = (local_50->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_70,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                         ,0xeef,pcVar4);
              testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
              testing::internal::AssertHelper::~AssertHelper(&local_70);
              if (local_68._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_68._M_head_impl + 8))();
              }
            }
            if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_50,local_50);
            }
            if (iVar1 != (internal)0x0) {
              local_68._M_head_impl._0_4_ = 1;
              local_70.data_._0_4_ =
                   (float)protobuf::internal::ExtensionSet::ExtensionSize
                                    (&(this->_impl_)._extensions_,
                                     proto2_unittest::packed_fixed32_extension);
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)local_58,"1",
                         "message.ExtensionSize(Traits::packed_fixed32_extension)",(int *)&local_68,
                         (int *)&local_70);
              iVar1 = local_58[0];
              if (local_58[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_68);
                if (local_50 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar4 = anon_var_dwarf_a12c75 + 5;
                }
                else {
                  pcVar4 = (local_50->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_70,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                           ,0xef0,pcVar4);
                testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
                testing::internal::AssertHelper::~AssertHelper(&local_70);
                if (local_68._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                }
              }
              if (local_50 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_50,local_50);
              }
              if (iVar1 != (internal)0x0) {
                local_68._M_head_impl._0_4_ = 1;
                local_70.data_._0_4_ =
                     (float)protobuf::internal::ExtensionSet::ExtensionSize
                                      (&(this->_impl_)._extensions_,
                                       proto2_unittest::packed_fixed64_extension);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_58,"1",
                           "message.ExtensionSize(Traits::packed_fixed64_extension)",
                           (int *)&local_68,(int *)&local_70);
                iVar1 = local_58[0];
                if (local_58[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_68);
                  if (local_50 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar4 = anon_var_dwarf_a12c75 + 5;
                  }
                  else {
                    pcVar4 = (local_50->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_70,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                             ,0xef1,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
                  testing::internal::AssertHelper::~AssertHelper(&local_70);
                  if (local_68._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_68._M_head_impl + 8))();
                  }
                }
                if (local_50 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_50,local_50);
                }
                if (iVar1 != (internal)0x0) {
                  local_68._M_head_impl._0_4_ = 1;
                  local_70.data_._0_4_ =
                       (float)protobuf::internal::ExtensionSet::ExtensionSize
                                        (&(this->_impl_)._extensions_,
                                         proto2_unittest::packed_sfixed32_extension);
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)local_58,"1",
                             "message.ExtensionSize(Traits::packed_sfixed32_extension)",
                             (int *)&local_68,(int *)&local_70);
                  iVar1 = local_58[0];
                  if (local_58[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_68);
                    if (local_50 ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar4 = anon_var_dwarf_a12c75 + 5;
                    }
                    else {
                      pcVar4 = (local_50->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_70,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                               ,0xef2,pcVar4);
                    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
                    testing::internal::AssertHelper::~AssertHelper(&local_70);
                    if (local_68._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_68._M_head_impl + 8))();
                    }
                  }
                  if (local_50 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_50,local_50);
                  }
                  if (iVar1 != (internal)0x0) {
                    local_68._M_head_impl._0_4_ = 1;
                    local_70.data_._0_4_ =
                         (float)protobuf::internal::ExtensionSet::ExtensionSize
                                          (&(this->_impl_)._extensions_,
                                           proto2_unittest::packed_sfixed64_extension);
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)local_58,"1",
                               "message.ExtensionSize(Traits::packed_sfixed64_extension)",
                               (int *)&local_68,(int *)&local_70);
                    iVar1 = local_58[0];
                    if (local_58[0] == (internal)0x0) {
                      testing::Message::Message((Message *)&local_68);
                      if (local_50 ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar4 = anon_var_dwarf_a12c75 + 5;
                      }
                      else {
                        pcVar4 = (local_50->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_70,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                 ,0xef3,pcVar4);
                      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
                      testing::internal::AssertHelper::~AssertHelper(&local_70);
                      if (local_68._M_head_impl !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0) {
                        (**(code **)(*(long *)local_68._M_head_impl + 8))();
                      }
                    }
                    if (local_50 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_50,local_50);
                    }
                    if (iVar1 != (internal)0x0) {
                      local_68._M_head_impl._0_4_ = 1;
                      local_70.data_._0_4_ =
                           (float)protobuf::internal::ExtensionSet::ExtensionSize
                                            (&(this->_impl_)._extensions_,
                                             proto2_unittest::packed_float_extension);
                      testing::internal::CmpHelperEQ<int,int>
                                ((internal *)local_58,"1",
                                 "message.ExtensionSize(Traits::packed_float_extension)",
                                 (int *)&local_68,(int *)&local_70);
                      iVar1 = local_58[0];
                      if (local_58[0] == (internal)0x0) {
                        testing::Message::Message((Message *)&local_68);
                        if (local_50 ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pcVar4 = anon_var_dwarf_a12c75 + 5;
                        }
                        else {
                          pcVar4 = (local_50->_M_dataplus)._M_p;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_70,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                   ,0xef4,pcVar4);
                        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
                        testing::internal::AssertHelper::~AssertHelper(&local_70);
                        if (local_68._M_head_impl !=
                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)0x0) {
                          (**(code **)(*(long *)local_68._M_head_impl + 8))();
                        }
                      }
                      if (local_50 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_50,local_50);
                      }
                      if (iVar1 != (internal)0x0) {
                        local_68._M_head_impl._0_4_ = 1;
                        local_70.data_._0_4_ =
                             (float)protobuf::internal::ExtensionSet::ExtensionSize
                                              (&(this->_impl_)._extensions_,
                                               proto2_unittest::packed_double_extension);
                        testing::internal::CmpHelperEQ<int,int>
                                  ((internal *)local_58,"1",
                                   "message.ExtensionSize(Traits::packed_double_extension)",
                                   (int *)&local_68,(int *)&local_70);
                        iVar1 = local_58[0];
                        if (local_58[0] == (internal)0x0) {
                          testing::Message::Message((Message *)&local_68);
                          if (local_50 ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar4 = anon_var_dwarf_a12c75 + 5;
                          }
                          else {
                            pcVar4 = (local_50->_M_dataplus)._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_70,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                     ,0xef5,pcVar4);
                          testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68)
                          ;
                          testing::internal::AssertHelper::~AssertHelper(&local_70);
                          if (local_68._M_head_impl !=
                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0) {
                            (**(code **)(*(long *)local_68._M_head_impl + 8))();
                          }
                        }
                        if (local_50 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_50,local_50);
                        }
                        if (iVar1 != (internal)0x0) {
                          local_68._M_head_impl._0_4_ = 1;
                          local_70.data_._0_4_ =
                               (float)protobuf::internal::ExtensionSet::ExtensionSize
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_bool_extension);
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)local_58,"1",
                                     "message.ExtensionSize(Traits::packed_bool_extension)",
                                     (int *)&local_68,(int *)&local_70);
                          iVar1 = local_58[0];
                          if (local_58[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_68);
                            if (local_50 ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar4 = anon_var_dwarf_a12c75 + 5;
                            }
                            else {
                              pcVar4 = (local_50->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_70,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                       ,0xef6,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      (&local_70,(Message *)&local_68);
                            testing::internal::AssertHelper::~AssertHelper(&local_70);
                            if (local_68._M_head_impl !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0) {
                              (**(code **)(*(long *)local_68._M_head_impl + 8))();
                            }
                          }
                          if (local_50 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_50,local_50);
                          }
                          if (iVar1 != (internal)0x0) {
                            local_68._M_head_impl._0_4_ = 1;
                            local_70.data_._0_4_ =
                                 (float)protobuf::internal::ExtensionSet::ExtensionSize
                                                  (&(this->_impl_)._extensions_,
                                                   proto2_unittest::packed_enum_extension);
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)local_58,"1",
                                       "message.ExtensionSize(Traits::packed_enum_extension)",
                                       (int *)&local_68,(int *)&local_70);
                            iVar1 = local_58[0];
                            if (local_58[0] == (internal)0x0) {
                              testing::Message::Message((Message *)&local_68);
                              if (local_50 ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar4 = anon_var_dwarf_a12c75 + 5;
                              }
                              else {
                                pcVar4 = (local_50->_M_dataplus)._M_p;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_70,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                         ,0xef7,pcVar4);
                              testing::internal::AssertHelper::operator=
                                        (&local_70,(Message *)&local_68);
                              testing::internal::AssertHelper::~AssertHelper(&local_70);
                              if (local_68._M_head_impl !=
                                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                (**(code **)(*(long *)local_68._M_head_impl + 8))();
                              }
                            }
                            if (local_50 !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&local_50,local_50);
                            }
                            if (iVar1 != (internal)0x0) {
                              local_68._M_head_impl._0_4_ = 0x259;
                              local_70.data_._0_4_ =
                                   (float)protobuf::internal::ExtensionSet::GetRepeatedInt32
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_int32_extension,0);
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)local_58,"601",
                                         "message.GetExtension(Traits::packed_int32_extension, 0)",
                                         (int *)&local_68,(int *)&local_70);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar4 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar4 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xefa,pcVar4);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_70.data_._0_4_ = 8.43582e-43;
                              local_68._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)protobuf::internal::ExtensionSet::GetRepeatedInt64
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_int64_extension,0);
                              testing::internal::CmpHelperEQ<int,long>
                                        ((internal *)local_58,"602",
                                         "message.GetExtension(Traits::packed_int64_extension, 0)",
                                         (int *)&local_70,(long *)&local_68);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar4 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar4 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xefb,pcVar4);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_68._M_head_impl._0_4_ = 0x25b;
                              local_70.data_._0_4_ =
                                   (float)protobuf::internal::ExtensionSet::GetRepeatedUInt32
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_uint32_extension,0);
                              testing::internal::CmpHelperEQ<int,unsigned_int>
                                        ((internal *)local_58,"603",
                                         "message.GetExtension(Traits::packed_uint32_extension, 0)",
                                         (int *)&local_68,(uint *)&local_70);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar4 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar4 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xefc,pcVar4);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_70.data_._0_4_ = 8.46384e-43;
                              local_68._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)protobuf::internal::ExtensionSet::GetRepeatedUInt64
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_uint64_extension,0);
                              testing::internal::CmpHelperEQ<int,unsigned_long>
                                        ((internal *)local_58,"604",
                                         "message.GetExtension(Traits::packed_uint64_extension, 0)",
                                         (int *)&local_70,(unsigned_long *)&local_68);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar4 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar4 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xefd,pcVar4);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_68._M_head_impl._0_4_ = 0x25d;
                              local_70.data_._0_4_ =
                                   (float)protobuf::internal::ExtensionSet::GetRepeatedInt32
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_sint32_extension,0);
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)local_58,"605",
                                         "message.GetExtension(Traits::packed_sint32_extension, 0)",
                                         (int *)&local_68,(int *)&local_70);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar4 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar4 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xefe,pcVar4);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_70.data_._0_4_ = 8.49187e-43;
                              local_68._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)protobuf::internal::ExtensionSet::GetRepeatedInt64
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_sint64_extension,0);
                              testing::internal::CmpHelperEQ<int,long>
                                        ((internal *)local_58,"606",
                                         "message.GetExtension(Traits::packed_sint64_extension, 0)",
                                         (int *)&local_70,(long *)&local_68);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar4 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar4 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xeff,pcVar4);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_68._M_head_impl._0_4_ = 0x25f;
                              local_70.data_._0_4_ =
                                   (float)protobuf::internal::ExtensionSet::GetRepeatedUInt32
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_fixed32_extension,0);
                              testing::internal::CmpHelperEQ<int,unsigned_int>
                                        ((internal *)local_58,"607",
                                         "message.GetExtension(Traits::packed_fixed32_extension, 0)"
                                         ,(int *)&local_68,(uint *)&local_70);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar4 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar4 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xf00,pcVar4);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_70.data_._0_4_ = 8.51989e-43;
                              local_68._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)protobuf::internal::ExtensionSet::GetRepeatedUInt64
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_fixed64_extension,0);
                              testing::internal::CmpHelperEQ<int,unsigned_long>
                                        ((internal *)local_58,"608",
                                         "message.GetExtension(Traits::packed_fixed64_extension, 0)"
                                         ,(int *)&local_70,(unsigned_long *)&local_68);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar4 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar4 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xf01,pcVar4);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_68._M_head_impl._0_4_ = 0x261;
                              local_70.data_._0_4_ =
                                   (float)protobuf::internal::ExtensionSet::GetRepeatedInt32
                                                    (&(this->_impl_)._extensions_,
                                                     proto2_unittest::packed_sfixed32_extension,0);
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)local_58,"609",
                                         "message.GetExtension(Traits::packed_sfixed32_extension, 0)"
                                         ,(int *)&local_68,(int *)&local_70);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar4 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar4 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xf02,pcVar4);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_70.data_._0_4_ = 8.54792e-43;
                              local_68._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)protobuf::internal::ExtensionSet::GetRepeatedInt64
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_sfixed64_extension,0);
                              testing::internal::CmpHelperEQ<int,long>
                                        ((internal *)local_58,"610",
                                         "message.GetExtension(Traits::packed_sfixed64_extension, 0)"
                                         ,(int *)&local_70,(long *)&local_68);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar4 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar4 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xf03,pcVar4);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_68._M_head_impl._0_4_ = 0x263;
                              local_70.data_._0_4_ =
                                   protobuf::internal::ExtensionSet::GetRepeatedFloat
                                             (&(this->_impl_)._extensions_,
                                              proto2_unittest::packed_float_extension,0);
                              testing::internal::CmpHelperEQ<int,float>
                                        ((internal *)local_58,"611",
                                         "message.GetExtension(Traits::packed_float_extension, 0)",
                                         (int *)&local_68,(float *)&local_70);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar4 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar4 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xf04,pcVar4);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              local_70.data_._0_4_ = 8.57595e-43;
                              local_68._M_head_impl =
                                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)protobuf::internal::ExtensionSet::GetRepeatedDouble
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_double_extension,0);
                              testing::internal::CmpHelperEQ<int,double>
                                        ((internal *)local_58,"612",
                                         "message.GetExtension(Traits::packed_double_extension, 0)",
                                         (int *)&local_70,(double *)&local_68);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar4 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar4 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xf05,pcVar4);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                              bVar2 = protobuf::internal::ExtensionSet::GetRepeatedBool
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_bool_extension,0);
                              local_68._M_head_impl._0_1_ = bVar2;
                              local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x0;
                              if (!bVar2) {
                                testing::Message::Message((Message *)&local_70);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_58,(internal *)&local_68,
                                           (AssertionResult *)
                                           "message.GetExtension(Traits::packed_bool_extension, 0)",
                                           "false","true",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_38,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xf06,(char *)CONCAT71(local_58._1_7_,local_58[0]));
                                testing::internal::AssertHelper::operator=
                                          (&local_38,(Message *)&local_70);
                                testing::internal::AssertHelper::~AssertHelper(&local_38);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)CONCAT71(local_58._1_7_,local_58[0]) != &local_48) {
                                  operator_delete((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT71(local_58._1_7_,local_58[0]),
                                                  local_48._M_allocated_capacity + 1);
                                }
                                if ((long *)CONCAT44(local_70.data_._4_4_,local_70.data_._0_4_) !=
                                    (long *)0x0) {
                                  (**(code **)(*(long *)CONCAT44(local_70.data_._4_4_,
                                                                 local_70.data_._0_4_) + 8))();
                                }
                              }
                              if (local_60 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_60,local_60);
                              }
                              iVar3 = protobuf::internal::ExtensionSet::GetRepeatedEnum
                                                (&(this->_impl_)._extensions_,
                                                 proto2_unittest::packed_enum_extension,0);
                              local_68._M_head_impl._0_4_ = iVar3;
                              testing::internal::
                              CmpHelperEQ<proto2_unittest::ForeignEnum,proto2_unittest::ForeignEnum>
                                        ((internal *)local_58,"Traits::FOREIGN_BAR",
                                         "message.GetExtension(Traits::packed_enum_extension, 0)",
                                         &TestUtilTraits<proto2_unittest::TestAllExtensions>::
                                          FOREIGN_BAR,(ForeignEnum *)&local_68);
                              if (local_58[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_68);
                                if (local_50 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar4 = anon_var_dwarf_a12c75 + 5;
                                }
                                else {
                                  pcVar4 = (local_50->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_70,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0xf08,pcVar4);
                                testing::internal::AssertHelper::operator=
                                          (&local_70,(Message *)&local_68);
                                testing::internal::AssertHelper::~AssertHelper(&local_70);
                                if (local_68._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_68._M_head_impl + 8))();
                                }
                              }
                              if (local_50 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_50,local_50);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ExpectLastRepeatedExtensionsRemovedPacked(
    const TestPackedExtensions& message) {
  using Traits = TestUtilTraits<TestPackedExtensions>;
  // Test that one element was removed.
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_int32_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_int64_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_uint32_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_uint64_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_sint32_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_sint64_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_fixed32_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_fixed64_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_sfixed32_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_sfixed64_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_float_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_double_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_bool_extension));
  ASSERT_EQ(1, message.ExtensionSize(Traits::packed_enum_extension));

  // Test that the remaining element is the correct one.
  EXPECT_EQ(601, message.GetExtension(Traits::packed_int32_extension, 0));
  EXPECT_EQ(602, message.GetExtension(Traits::packed_int64_extension, 0));
  EXPECT_EQ(603, message.GetExtension(Traits::packed_uint32_extension, 0));
  EXPECT_EQ(604, message.GetExtension(Traits::packed_uint64_extension, 0));
  EXPECT_EQ(605, message.GetExtension(Traits::packed_sint32_extension, 0));
  EXPECT_EQ(606, message.GetExtension(Traits::packed_sint64_extension, 0));
  EXPECT_EQ(607, message.GetExtension(Traits::packed_fixed32_extension, 0));
  EXPECT_EQ(608, message.GetExtension(Traits::packed_fixed64_extension, 0));
  EXPECT_EQ(609, message.GetExtension(Traits::packed_sfixed32_extension, 0));
  EXPECT_EQ(610, message.GetExtension(Traits::packed_sfixed64_extension, 0));
  EXPECT_EQ(611, message.GetExtension(Traits::packed_float_extension, 0));
  EXPECT_EQ(612, message.GetExtension(Traits::packed_double_extension, 0));
  EXPECT_TRUE(message.GetExtension(Traits::packed_bool_extension, 0));
  EXPECT_EQ(Traits::FOREIGN_BAR,
            message.GetExtension(Traits::packed_enum_extension, 0));
}